

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::cmInstallTargetGenerator
          (cmInstallTargetGenerator *this,string *targetName,char *dest,bool implib,
          char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all,bool optional,
          cmListFileBacktrace *backtrace)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__s;
  allocator<char> local_3b;
  byte local_3a;
  undefined1 local_39;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool exclude_from_all_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  char *file_permissions_local;
  char *pcStack_20;
  bool implib_local;
  char *dest_local;
  string *targetName_local;
  cmInstallTargetGenerator *this_local;
  
  local_39 = exclude_from_all;
  local_3a = optional;
  pvStack_38 = configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)file_permissions;
  file_permissions_local._7_1_ = implib;
  pcStack_20 = dest;
  dest_local = (char *)targetName;
  targetName_local = (string *)this;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message,exclude_from_all)
  ;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallTargetGenerator_00b8e4c8;
  std::__cxx11::string::string((string *)&this->TargetName,(string *)targetName);
  __s = configurations_local;
  this->Target = (cmGeneratorTarget *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->FilePermissions,(char *)__s,&local_3b);
  std::allocator<char>::~allocator(&local_3b);
  this->ImportLibrary = (bool)(file_permissions_local._7_1_ & 1);
  this->Optional = (bool)(local_3a & 1);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  this->NamelinkMode = NamelinkModeNone;
  return;
}

Assistant:

cmInstallTargetGenerator::cmInstallTargetGenerator(
  std::string targetName, const char* dest, bool implib,
  const char* file_permissions, std::vector<std::string> const& configurations,
  const char* component, MessageLevel message, bool exclude_from_all,
  bool optional, cmListFileBacktrace backtrace)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all)
  , TargetName(std::move(targetName))
  , Target(nullptr)
  , FilePermissions(file_permissions)
  , ImportLibrary(implib)
  , Optional(optional)
  , Backtrace(std::move(backtrace))
{
  this->ActionsPerConfig = true;
  this->NamelinkMode = NamelinkModeNone;
}